

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

size_t __thiscall
absl::lts_20250127::Cord::EstimatedMemoryUsage(Cord *this,CordMemoryAccounting accounting_method)

{
  Nullable<absl::cord_internal::CordRep_*> rep;
  size_t sVar1;
  
  rep = InlineRep::tree(&this->contents_);
  sVar1 = 0x10;
  if (rep != (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    if (accounting_method == kTotal) {
      sVar1 = cord_internal::GetEstimatedMemoryUsage(rep);
    }
    else if (accounting_method == kTotalMorePrecise) {
      sVar1 = cord_internal::GetMorePreciseMemoryUsage(rep);
    }
    else {
      if (accounting_method != kFairShare) {
        return 0x10;
      }
      sVar1 = cord_internal::GetEstimatedFairShareMemoryUsage(rep);
    }
    sVar1 = sVar1 + 0x10;
  }
  return sVar1;
}

Assistant:

inline size_t Cord::EstimatedMemoryUsage(
    CordMemoryAccounting accounting_method) const {
  size_t result = sizeof(Cord);
  if (const absl::cord_internal::CordRep* rep = contents_.tree()) {
    switch (accounting_method) {
      case CordMemoryAccounting::kFairShare:
        result += cord_internal::GetEstimatedFairShareMemoryUsage(rep);
        break;
      case CordMemoryAccounting::kTotalMorePrecise:
        result += cord_internal::GetMorePreciseMemoryUsage(rep);
        break;
      case CordMemoryAccounting::kTotal:
        result += cord_internal::GetEstimatedMemoryUsage(rep);
        break;
    }
  }
  return result;
}